

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O2

void __thiscall
Js::PropertyRecord::PropertyRecord
          (PropertyRecord *this,WCHAR *buffer,int length,DWORD bytelength,bool isSymbol)

{
  WCHAR WVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint32 local_34 [2];
  uint32 numericValue;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013780a0;
  this->pid = -1;
  this->isSymbol = isSymbol;
  this->byteCount = bytelength;
  if (buffer == (WCHAR *)0x0 || length < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x1b,"(length >= 0 && buffer != nullptr)",
                                "length >= 0 && buffer != nullptr");
    if (!bVar3) goto LAB_006e73a9;
    *puVar5 = 0;
  }
  uVar6 = 0;
  uVar7 = 0;
  if (0 < length) {
    uVar7 = (ulong)(uint)length;
  }
  bVar3 = 0 < length && (!isSymbol && length < 0xb);
  this->isNumeric = bVar3;
  this->hash = 0x811c9dc5;
  uVar8 = 0x811c9dc5;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    WVar1 = buffer[uVar6];
    if ((bVar3) && ((ushort)(WVar1 + L'ￆ') < 0xfff6)) {
      this->isNumeric = false;
      bVar3 = false;
    }
    uVar8 = (uVar8 ^ (ushort)WVar1) * 0x1000193;
    this->hash = uVar8;
    *(WCHAR *)((long)&this[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + uVar6 * 2) = WVar1;
  }
  *(char16 *)
   ((long)&this[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
   + (long)length * 2) = L'\0';
  if (bVar3) {
    bVar3 = IsPropertyNameNumeric((char16 *)(this + 1),this->byteCount >> 1,local_34);
    this->isNumeric = bVar3;
    if (bVar3) {
      *(uint32 *)
       ((long)&this[1].super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject + (ulong)(this->byteCount & 0xfffffffe) + 2) =
           local_34[0];
      uVar4 = GetNumericValue(this);
      if (uVar4 != local_34[0]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                    ,0x36,"(GetNumericValue() == numericValue)",
                                    "GetNumericValue() == numericValue");
        if (!bVar3) {
LAB_006e73a9:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
  }
  return;
}

Assistant:

PropertyRecord::PropertyRecord(const WCHAR* buffer, const int length, DWORD bytelength, bool isSymbol)
        : pid(Js::Constants::NoProperty), isSymbol(isSymbol), byteCount(bytelength)
    {
        Assert(length >= 0 && buffer != nullptr);

        WCHAR* target = (WCHAR*)((PropertyRecord*)this + 1);
        isNumeric = (isSymbol || length > 10 || length <= 0) ? false : true;
        hash = CC_HASH_OFFSET_VALUE;

        for (int i = 0; i < length; i++)
        {
            const WCHAR byte = buffer[i];
            if (isNumeric)
            {
                if (byte < _u('0') || byte > _u('9'))
                  isNumeric = false;
            }

            CC_HASH_LOGIC(hash, byte);
            target[i] = byte;
        }
        target[length] = WCHAR(0);

        if (isNumeric)
        {
            uint32 numericValue;
            isNumeric = Js::PropertyRecord::IsPropertyNameNumeric(this->GetBuffer(), this->GetLength(), &numericValue);
            if (isNumeric)
            {
                *(uint32 *)(this->GetBuffer() + this->GetLength() + 1) = numericValue;
                Assert(GetNumericValue() == numericValue);
            }
        }
    }